

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O1

void __thiscall
spvtools::opt::Loop::ComputeLoopStructuredOrder
          (Loop *this,
          vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *ordered_loop_blocks,bool include_pre_header,bool include_merge)

{
  pointer *pppBVar1;
  IRContext *pIVar2;
  CFG *this_00;
  iterator iVar3;
  _Any_data *p_Var4;
  undefined8 uVar5;
  bool bVar6;
  undefined8 uVar7;
  BasicBlock *bb;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> order;
  BasicBlock *local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  pIVar2 = this->context_;
  if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar2);
  }
  this_00 = (pIVar2->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::reserve
            (ordered_loop_blocks,
             (ulong)include_merge + (ulong)include_pre_header +
             (this->loop_basic_blocks_)._M_h._M_element_count);
  if ((include_pre_header) && (this->loop_preheader_ != (BasicBlock *)0x0)) {
    iVar3._M_current =
         (ordered_loop_blocks->
         super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (ordered_loop_blocks->
        super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
      _M_realloc_insert<spvtools::opt::BasicBlock*const&>
                ((vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>> *)
                 ordered_loop_blocks,iVar3,&this->loop_preheader_);
    }
    else {
      *iVar3._M_current = this->loop_preheader_;
      pppBVar1 = &(ordered_loop_blocks->
                  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppBVar1 = *pppBVar1 + 1;
    }
  }
  pIVar2 = this->context_;
  if ((pIVar2->feature_mgr_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
      .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl ==
      (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(pIVar2);
  }
  bVar6 = EnumSet<spv::Capability>::contains
                    (&((pIVar2->feature_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                       .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl)
                      ->capabilities_,CapabilityShader);
  if (bVar6) {
    local_48 = (code *)0x0;
    local_58._M_unused._M_object = &local_58;
    local_58._8_8_ = &local_58;
    CFG::ComputeStructuredOrder
              (this_00,this->loop_header_->function_,this->loop_header_,this->loop_merge_,
               (list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
               &local_58);
    uVar5 = local_58._M_unused._0_8_;
    if ((_Any_data *)local_58._M_unused._0_8_ != &local_58) {
      uVar7 = local_58._M_unused._0_8_;
      do {
        local_60 = *(BasicBlock **)(uVar7 + 0x10);
        uVar5 = local_58._M_unused._0_8_;
        if (local_60 == this->loop_merge_) break;
        iVar3._M_current =
             (ordered_loop_blocks->
             super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (ordered_loop_blocks->
            super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
          _M_realloc_insert<spvtools::opt::BasicBlock*const&>
                    ((vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>
                      *)ordered_loop_blocks,iVar3,&local_60);
        }
        else {
          *iVar3._M_current = local_60;
          pppBVar1 = &(ordered_loop_blocks->
                      super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppBVar1 = *pppBVar1 + 1;
        }
        uVar7 = *(undefined8 *)uVar7;
        uVar5 = local_58._M_unused._0_8_;
      } while ((_Any_data *)uVar7 != &local_58);
    }
    while ((_Any_data *)uVar5 != &local_58) {
      p_Var4 = *(_Any_data **)uVar5;
      operator_delete((void *)uVar5,0x18);
      uVar5 = p_Var4;
    }
  }
  else {
    pcStack_40 = std::
                 _Function_handler<void_(spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp:485:23)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp:485:23)>
               ::_M_manager;
    local_58._M_unused._M_object = ordered_loop_blocks;
    local_58._8_8_ = this;
    CFG::ForEachBlockInReversePostOrder
              (this_00,this->loop_header_,(function<void_(spvtools::opt::BasicBlock_*)> *)&local_58)
    ;
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
  }
  if ((include_merge) && (this->loop_merge_ != (BasicBlock *)0x0)) {
    iVar3._M_current =
         (ordered_loop_blocks->
         super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (ordered_loop_blocks->
        super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
      _M_realloc_insert<spvtools::opt::BasicBlock*const&>
                ((vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>> *)
                 ordered_loop_blocks,iVar3,&this->loop_merge_);
    }
    else {
      *iVar3._M_current = this->loop_merge_;
      pppBVar1 = &(ordered_loop_blocks->
                  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppBVar1 = *pppBVar1 + 1;
    }
  }
  return;
}

Assistant:

void Loop::ComputeLoopStructuredOrder(
    std::vector<BasicBlock*>* ordered_loop_blocks, bool include_pre_header,
    bool include_merge) const {
  CFG& cfg = *context_->cfg();

  // Reserve the memory: all blocks in the loop + extra if needed.
  ordered_loop_blocks->reserve(GetBlocks().size() + include_pre_header +
                               include_merge);

  if (include_pre_header && GetPreHeaderBlock())
    ordered_loop_blocks->push_back(loop_preheader_);

  bool is_shader =
      context_->get_feature_mgr()->HasCapability(spv::Capability::Shader);
  if (!is_shader) {
    cfg.ForEachBlockInReversePostOrder(
        loop_header_, [ordered_loop_blocks, this](BasicBlock* bb) {
          if (IsInsideLoop(bb)) ordered_loop_blocks->push_back(bb);
        });
  } else {
    // If this is a shader, it is possible that there are unreachable merge and
    // continue blocks that must be copied to retain the structured order.
    // The structured order will include these.
    std::list<BasicBlock*> order;
    cfg.ComputeStructuredOrder(loop_header_->GetParent(), loop_header_,
                               loop_merge_, &order);
    for (BasicBlock* bb : order) {
      if (bb == GetMergeBlock()) {
        break;
      }
      ordered_loop_blocks->push_back(bb);
    }
  }
  if (include_merge && GetMergeBlock())
    ordered_loop_blocks->push_back(loop_merge_);
}